

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O0

void __thiscall Shell::EqualityProxyMono::addAxioms(EqualityProxyMono *this,UnitList **units)

{
  bool bVar1;
  int *in_RDI;
  Iterator it;
  UnitList **in_stack_000000d0;
  EqualityProxyMono *in_stack_000000d8;
  TermList in_stack_000000e0;
  UnitList **in_stack_00000188;
  EqualityProxyMono *in_stack_00000190;
  DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffb8;
  Iterator *in_stack_ffffffffffffffc0;
  
  if (*in_RDI == 3) {
    addCongruenceAxioms(in_stack_00000190,in_stack_00000188);
  }
  Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator::
  Iterator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
            Iterator::hasNext((Iterator *)0xb90777);
    if (!bVar1) break;
    Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator::
    nextKey((Iterator *)in_stack_ffffffffffffffb8);
    addLocalAxioms(in_stack_000000d8,in_stack_000000d0,in_stack_000000e0);
  }
  return;
}

Assistant:

void EqualityProxyMono::addAxioms(UnitList*& units)
{
  // if we're adding congruence axioms, we need to add them before adding the local axioms.
  // Local axioms are added only for sorts on which equality is used, and the congruence axioms
  // may spread the equality use into new sorts
  if (_opt == Options::EqualityProxy::RSTC) {
    addCongruenceAxioms(units);
  }

  DHMap<TermList, unsigned>::Iterator it(s_proxyPredicates);
  while(it.hasNext()) {
    addLocalAxioms(units, it.nextKey());
  }
}